

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printTotalsDivider(ConsoleReporter *this,Totals *totals)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  ostream *poVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong __n;
  Colour local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  Totals *local_38;
  
  sVar2 = (totals->testCases).passed;
  sVar3 = (totals->testCases).failed;
  sVar4 = (totals->testCases).failedButOk;
  uVar9 = sVar3 + sVar2 + sVar4;
  if (uVar9 == 0) {
    poVar5 = (ostream *)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
    local_59.m_moved = false;
    Colour::use(BrightYellow);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
    _M_construct(&local_58,0x4f,'=');
    std::operator<<(poVar5,(string *)&local_58);
  }
  else {
    uVar6 = (sVar3 * 0x50) / uVar9;
    uVar10 = 1;
    __n = uVar6;
    if (sVar3 * 0x50 < uVar9) {
      __n = uVar10;
    }
    if (sVar3 == 0) {
      __n = uVar6;
    }
    uVar7 = (sVar4 * 0x50) / uVar9;
    uVar6 = uVar7;
    if (sVar4 * 0x50 < uVar9) {
      uVar6 = uVar10;
    }
    if (sVar4 == 0) {
      uVar6 = uVar7;
    }
    uVar7 = (sVar2 * 0x50) / uVar9;
    if (uVar9 <= sVar2 * 0x50) {
      uVar10 = uVar7;
    }
    if (sVar2 == 0) {
      uVar10 = uVar7;
    }
    while (uVar7 = uVar10, uVar9 = uVar6, uVar9 + __n + uVar7 < 0x4f) {
      uVar8 = uVar7;
      if (uVar7 < uVar9) {
        uVar8 = uVar9;
      }
      if (uVar9 < __n && uVar7 < __n) {
        uVar8 = __n;
      }
      uVar8 = uVar8 + 1;
      uVar10 = uVar8;
      uVar6 = uVar9;
      if (uVar7 < uVar9) {
        uVar10 = uVar7;
        uVar6 = uVar8;
      }
      if (uVar9 < __n && uVar7 < __n) {
        uVar6 = uVar9;
        __n = uVar8;
        uVar10 = uVar7;
      }
    }
    while (uVar6 = uVar7, uVar10 = uVar9, 0x4f < uVar10 + __n + uVar6) {
      uVar8 = uVar6;
      if (uVar6 < uVar10) {
        uVar8 = uVar10;
      }
      if (uVar10 < __n && uVar6 < __n) {
        uVar8 = __n;
      }
      uVar8 = uVar8 - 1;
      uVar7 = uVar8;
      uVar9 = uVar10;
      if (uVar6 < uVar10) {
        uVar7 = uVar6;
        uVar9 = uVar8;
      }
      if (uVar10 < __n && uVar6 < __n) {
        uVar9 = uVar10;
        __n = uVar8;
        uVar7 = uVar6;
      }
    }
    poVar5 = (ostream *)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
    local_59.m_moved = false;
    local_38 = totals;
    Colour::use(BrightRed);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
    _M_construct(&local_58,__n,'=');
    std::operator<<(poVar5,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    Colour::~Colour(&local_59);
    poVar5 = (ostream *)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
    local_59.m_moved = false;
    Colour::use(BrightYellow);
    paVar1 = &local_58.field_2;
    local_58._M_dataplus._M_p = (pointer)paVar1;
    clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
    _M_construct(&local_58,uVar10,'=');
    std::operator<<(poVar5,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    Colour::~Colour(&local_59);
    poVar5 = (ostream *)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
    if ((local_38->testCases).failedButOk == 0 && (local_38->testCases).failed == 0) {
      local_59.m_moved = false;
      Colour::use(BrightGreen);
      local_58._M_dataplus._M_p = (pointer)paVar1;
      clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_construct(&local_58,uVar6,'=');
      std::operator<<(poVar5,(string *)&local_58);
    }
    else {
      local_59.m_moved = false;
      Colour::use(Green);
      local_58._M_dataplus._M_p = (pointer)paVar1;
      clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_construct(&local_58,uVar6,'=');
      std::operator<<(poVar5,(string *)&local_58);
    }
  }
  std::__cxx11::string::~string((string *)&local_58);
  Colour::~Colour(&local_59);
  std::operator<<((ostream *)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,'\n'
                 );
  return;
}

Assistant:

void ConsoleReporter::printTotalsDivider(Totals const& totals) {
    if (totals.testCases.total() > 0) {
        std::size_t failedRatio = makeRatio(totals.testCases.failed, totals.testCases.total());
        std::size_t failedButOkRatio = makeRatio(totals.testCases.failedButOk, totals.testCases.total());
        std::size_t passedRatio = makeRatio(totals.testCases.passed, totals.testCases.total());
        while (failedRatio + failedButOkRatio + passedRatio < CATCH_CONFIG_CONSOLE_WIDTH - 1)
            findMax(failedRatio, failedButOkRatio, passedRatio)++;
        while (failedRatio + failedButOkRatio + passedRatio > CATCH_CONFIG_CONSOLE_WIDTH - 1)
            findMax(failedRatio, failedButOkRatio, passedRatio)--;

        stream << Colour(Colour::Error) << std::string(failedRatio, '=');
        stream << Colour(Colour::ResultExpectedFailure) << std::string(failedButOkRatio, '=');
        if (totals.testCases.allPassed())
            stream << Colour(Colour::ResultSuccess) << std::string(passedRatio, '=');
        else
            stream << Colour(Colour::Success) << std::string(passedRatio, '=');
    } else {
        stream << Colour(Colour::Warning) << std::string(CATCH_CONFIG_CONSOLE_WIDTH - 1, '=');
    }
    stream << '\n';
}